

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> * __thiscall
math::wide_integer::uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false>::operator-=
          (uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *this,
          uintwide_t<131072U,_unsigned_int,_std::allocator<void>,_false> *other)

{
  pointer pvVar1;
  pointer pvVar2;
  unsigned_fast_type i;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  
  if (this == other) {
    uVar5 = (ulong)(this->values).
                   super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                   .elem_count;
    if (uVar5 != 0) {
      memset((this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems,0,uVar5 << 2);
    }
  }
  else {
    pvVar1 = (this->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    pvVar2 = (other->values).
             super_dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>.
             elems;
    lVar3 = 0;
    bVar4 = false;
    do {
      uVar5 = ((ulong)pvVar1[lVar3] - (ulong)bVar4) - (ulong)pvVar2[lVar3];
      pvVar1[lVar3] = (value_type)uVar5;
      bVar4 = uVar5 >> 0x20 != 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x1000);
  }
  return this;
}

Assistant:

constexpr auto operator-=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<typename representation_type::value_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else
      {
        // Unary subtraction function.
        const auto has_borrow = eval_subtract_n(values.begin(),
                                                values.cbegin(),
                                                other.values.cbegin(),
                                                number_of_limbs,
                                                false);

        static_cast<void>(has_borrow);
      }

      return *this;
    }